

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O0

void mbedtls_ct_memmove_left(void *start,size_t total,size_t offset)

{
  uint uVar1;
  mbedtls_ct_condition_t condition;
  ulong in_RSI;
  long in_RDI;
  uchar next;
  uchar current;
  size_t n;
  mbedtls_ct_condition_t no_op;
  size_t i;
  uchar *buf;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 local_38;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    condition = mbedtls_ct_uint_gt(CONCAT17(in_stack_ffffffffffffffc7,
                                            CONCAT16(in_stack_ffffffffffffffc6,
                                                     in_stack_ffffffffffffffc0)),
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    for (local_38 = 0; local_38 < in_RSI - 1; local_38 = local_38 + 1) {
      in_stack_ffffffffffffffc7 = *(undefined1 *)(in_RDI + local_38);
      in_stack_ffffffffffffffc6 = *(undefined1 *)(in_RDI + 1 + local_38);
      uVar1 = mbedtls_ct_uint_if(CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(in_stack_ffffffffffffffc6,
                                                   in_stack_ffffffffffffffc0)),
                                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      *(char *)(in_RDI + local_38) = (char)uVar1;
    }
    uVar1 = mbedtls_ct_uint_if_else_0(condition,(uint)*(byte *)(in_RDI + (in_RSI - 1)));
    *(char *)(in_RDI + (in_RSI - 1)) = (char)uVar1;
  }
  return;
}

Assistant:

void mbedtls_ct_memmove_left(void *start, size_t total, size_t offset)
{
    volatile unsigned char *buf = (unsigned char *) start;
    for (size_t i = 0; i < total; i++) {
        mbedtls_ct_condition_t no_op = mbedtls_ct_uint_gt(total - offset, i);
        /* The first `total - offset` passes are a no-op. The last
         * `offset` passes shift the data one byte to the left and
         * zero out the last byte. */
        for (size_t n = 0; n < total - 1; n++) {
            unsigned char current = buf[n];
            unsigned char next    = buf[n+1];
            buf[n] = mbedtls_ct_uint_if(no_op, current, next);
        }
        buf[total-1] = mbedtls_ct_uint_if_else_0(no_op, buf[total-1]);
    }
}